

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

LockStatus __thiscall CategoriesMutex::try_lock_unsafe(CategoriesMutex *this,int category)

{
  int iVar1;
  const_reference pvVar2;
  int category_local;
  CategoriesMutex *this_local;
  
  if ((this->current_category_ == -1) || (category == this->current_category_)) {
    iVar1 = this->count_;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->category_sizes_,(long)category);
    if (iVar1 == *pvVar2) {
      this_local._4_4_ = THREADS_COUNT_EXCEEDED;
    }
    else {
      this->current_category_ = category;
      this->count_ = this->count_ + 1;
      this_local._4_4_ = LOCK_SUCCESS;
    }
  }
  else {
    this_local._4_4_ = ANOTHER_CATEGORY;
  }
  return this_local._4_4_;
}

Assistant:

LockStatus try_lock_unsafe(int category) {
        if (current_category_ != -1 && category != current_category_) {
            return ANOTHER_CATEGORY;
        }

        if (count_ == category_sizes_[category]) {
            return THREADS_COUNT_EXCEEDED;
        }

        current_category_ = category;
        ++count_;
        return LOCK_SUCCESS;
    }